

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_parse_hex(char *p,int length)

{
  int iVar1;
  int local_1c;
  int local_18;
  int len;
  int i;
  int length_local;
  char *p_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < length; local_1c = local_1c + 1) {
    if ((p[local_1c] < 'a') || ('f' < p[local_1c])) {
      if ((p[local_1c] < 'A') || ('F' < p[local_1c])) {
        iVar1 = p[local_1c] + -0x30;
      }
      else {
        iVar1 = p[local_1c] + -0x37;
      }
    }
    else {
      iVar1 = p[local_1c] + -0x57;
    }
    local_18 = iVar1 + local_18 * 0x10;
  }
  return local_18;
}

Assistant:

NK_INTERN int
nk_parse_hex(const char *p, int length)
{
    int i = 0;
    int len = 0;
    while (len < length) {
        i <<= 4;
        if (p[len] >= 'a' && p[len] <= 'f')
            i += ((p[len] - 'a') + 10);
        else if (p[len] >= 'A' && p[len] <= 'F')
            i += ((p[len] - 'A') + 10);
        else i += (p[len] - '0');
        len++;
    }
    return i;
}